

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

uint16_t __thiscall
icu_63::double_conversion::Bignum::DivideModuloIntBignum(Bignum *this,Bignum *other)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint factor;
  uint *puVar6;
  int division_estimate;
  int quotient;
  Chunk other_bigit;
  Chunk this_bigit;
  uint16_t result;
  Bignum *other_local;
  Bignum *this_local;
  
  iVar4 = BigitLength(this);
  iVar5 = BigitLength(other);
  if (iVar4 < iVar5) {
    this_local._6_2_ = 0;
  }
  else {
    Align(this,other);
    other_bigit._2_2_ = 0;
    while( true ) {
      iVar4 = BigitLength(this);
      iVar5 = BigitLength(other);
      if (iVar4 <= iVar5) break;
      puVar6 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_ + -1);
      other_bigit._2_2_ = other_bigit._2_2_ + (short)*puVar6;
      puVar6 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_ + -1);
      SubtractTimes(this,other,*puVar6);
    }
    puVar6 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_ + -1);
    uVar1 = *puVar6;
    puVar6 = Vector<unsigned_int>::operator[](&other->bigits_,other->used_digits_ + -1);
    uVar2 = *puVar6;
    if (other->used_digits_ == 1) {
      puVar6 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_ + -1);
      *puVar6 = uVar1 - uVar2 * (uVar1 / uVar2);
      this_local._6_2_ = other_bigit._2_2_ + (short)(uVar1 / uVar2);
      Clamp(this);
    }
    else {
      factor = uVar1 / (uVar2 + 1);
      other_bigit._2_2_ = other_bigit._2_2_ + (short)factor;
      SubtractTimes(this,other,factor);
      this_local._6_2_ = other_bigit._2_2_;
      if (uVar2 * (factor + 1) <= uVar1) {
        while (bVar3 = LessEqual(other,this), bVar3) {
          SubtractBignum(this,other);
          other_bigit._2_2_ = other_bigit._2_2_ + 1;
        }
        this_local._6_2_ = other_bigit._2_2_;
      }
    }
  }
  return this_local._6_2_;
}

Assistant:

uint16_t Bignum::DivideModuloIntBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  ASSERT(other.used_digits_ > 0);

  // Easy case: if we have less digits than the divisor than the result is 0.
  // Note: this handles the case where this == 0, too.
  if (BigitLength() < other.BigitLength()) {
    return 0;
  }

  Align(other);

  uint16_t result = 0;

  // Start by removing multiples of 'other' until both numbers have the same
  // number of digits.
  while (BigitLength() > other.BigitLength()) {
    // This naive approach is extremely inefficient if `this` divided by other
    // is big. This function is implemented for doubleToString where
    // the result should be small (less than 10).
    ASSERT(other.bigits_[other.used_digits_ - 1] >= ((1 << kBigitSize) / 16));
    ASSERT(bigits_[used_digits_ - 1] < 0x10000);
    // Remove the multiples of the first digit.
    // Example this = 23 and other equals 9. -> Remove 2 multiples.
    result += static_cast<uint16_t>(bigits_[used_digits_ - 1]);
    SubtractTimes(other, bigits_[used_digits_ - 1]);
  }

  ASSERT(BigitLength() == other.BigitLength());

  // Both bignums are at the same length now.
  // Since other has more than 0 digits we know that the access to
  // bigits_[used_digits_ - 1] is safe.
  Chunk this_bigit = bigits_[used_digits_ - 1];
  Chunk other_bigit = other.bigits_[other.used_digits_ - 1];

  if (other.used_digits_ == 1) {
    // Shortcut for easy (and common) case.
    int quotient = this_bigit / other_bigit;
    bigits_[used_digits_ - 1] = this_bigit - other_bigit * quotient;
    ASSERT(quotient < 0x10000);
    result += static_cast<uint16_t>(quotient);
    Clamp();
    return result;
  }

  int division_estimate = this_bigit / (other_bigit + 1);
  ASSERT(division_estimate < 0x10000);
  result += static_cast<uint16_t>(division_estimate);
  SubtractTimes(other, division_estimate);

  if (other_bigit * (division_estimate + 1) > this_bigit) {
    // No need to even try to subtract. Even if other's remaining digits were 0
    // another subtraction would be too much.
    return result;
  }

  while (LessEqual(other, *this)) {
    SubtractBignum(other);
    result++;
  }
  return result;
}